

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

Matcher<unsigned_int> * testing::A<unsigned_int>(void)

{
  MatcherInterface<unsigned_int> *pMVar1;
  Matcher<unsigned_int> *in_RDI;
  
  pMVar1 = (MatcherInterface<unsigned_int> *)operator_new(8);
  (pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_001b8260;
  (in_RDI->super_MatcherBase<unsigned_int>).impl_.value_ = pMVar1;
  (in_RDI->super_MatcherBase<unsigned_int>).impl_.link_.next_ =
       &(in_RDI->super_MatcherBase<unsigned_int>).impl_.link_;
  (in_RDI->super_MatcherBase<unsigned_int>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001b81c8;
  return in_RDI;
}

Assistant:

inline Matcher<T> A() { return MakeMatcher(new internal::AnyMatcherImpl<T>()); }